

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O1

int Gia_ManEquivCheckLits(Gia_Man_t *p,int nLits)

{
  int iVar1;
  long lVar2;
  
  if ((long)p->nObjs < 1) {
    iVar1 = 0;
  }
  else {
    lVar2 = 0;
    iVar1 = 0;
    do {
      iVar1 = (iVar1 + 1) - (uint)((~(uint)p->pReprs[lVar2] & 0xfffffff) == 0);
      lVar2 = lVar2 + 1;
    } while (p->nObjs != lVar2);
  }
  if (iVar1 != nLits) {
    Abc_Print(1,"Detected a mismatch in counting equivalence classes (%d).\n");
  }
  return 1;
}

Assistant:

int Gia_ManEquivCheckLits( Gia_Man_t * p, int nLits )
{
    int nLitsReal = Gia_ManEquivCountLitsAll( p );
    if ( nLitsReal != nLits )
        Abc_Print( 1, "Detected a mismatch in counting equivalence classes (%d).\n", nLitsReal - nLits );
    return 1;
}